

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

QGraphicsItemCache * __thiscall QGraphicsItemPrivate::extraItemCache(QGraphicsItemPrivate *this)

{
  QGraphicsItemPrivate *value;
  QGraphicsItemPrivate *this_00;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  QGraphicsItemPrivate *that;
  QGraphicsItemCache *c;
  QGraphicsItemCache *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff90;
  QGraphicsItemPrivate *in_stack_ffffffffffffff98;
  Extra type;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  type = (Extra)((ulong)in_RDI >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  extra(in_stack_ffffffffffffff98,(Extra)((ulong)in_stack_ffffffffffffff90 >> 0x20));
  value = (QGraphicsItemPrivate *)qvariant_cast<void*>((QVariant *)in_stack_ffffffffffffff70);
  ::QVariant::~QVariant(&local_28);
  this_00 = value;
  if (value == (QGraphicsItemPrivate *)0x0) {
    this_00 = (QGraphicsItemPrivate *)operator_new(0x48);
    QGraphicsItemCache::QGraphicsItemCache(in_stack_ffffffffffffff70);
    ::QVariant::fromValue<void_*,_true>(&this_00->_vptr_QGraphicsItemPrivate);
    setExtra(this_00,type,(QVariant *)value);
    ::QVariant::~QVariant(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QGraphicsItemCache *)this_00;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsItemCache *QGraphicsItemPrivate::extraItemCache() const
{
    QGraphicsItemCache *c = (QGraphicsItemCache *)qvariant_cast<void *>(extra(ExtraCacheData));
    if (!c) {
        QGraphicsItemPrivate *that = const_cast<QGraphicsItemPrivate *>(this);
        c = new QGraphicsItemCache;
        that->setExtra(ExtraCacheData, QVariant::fromValue<void *>(c));
    }
    return c;
}